

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_route.c
# Opt level: O0

int csp_route_security_check(uint32_t security_opts,csp_iface_t *iface,csp_packet_t *packet)

{
  int iVar1;
  csp_packet_t *in_RDX;
  long in_RSI;
  uint in_EDI;
  undefined4 in_stack_fffffffffffffffc;
  
  if (((in_RDX->id).flags & 1) == 0) {
    if ((in_EDI & 0x40) != 0) {
      *(int *)(in_RSI + 0x38) = *(int *)(in_RSI + 0x38) + 1;
      return -0x66;
    }
  }
  else {
    iVar1 = csp_crc32_verify(in_RDX);
    if (iVar1 != 0) {
      *(int *)(in_RSI + 0x38) = *(int *)(in_RSI + 0x38) + 1;
      return -0x66;
    }
  }
  if (((in_RDX->id).flags & 8) == 0) {
    if ((in_EDI & 4) != 0) {
      *(int *)(in_RSI + 0x40) = *(int *)(in_RSI + 0x40) + 1;
      return -100;
    }
  }
  else {
    iVar1 = csp_hmac_verify((csp_packet_t *)CONCAT44(in_stack_fffffffffffffffc,in_EDI),
                            SUB81((ulong)in_RSI >> 0x38,0));
    if (iVar1 != 0) {
      *(int *)(in_RSI + 0x40) = *(int *)(in_RSI + 0x40) + 1;
      return -100;
    }
  }
  if ((((in_RDX->id).flags & 2) == 0) && ((in_EDI & 1) != 0)) {
    *(int *)(in_RSI + 0x38) = *(int *)(in_RSI + 0x38) + 1;
    iVar1 = -2;
  }
  else {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int csp_route_security_check(uint32_t security_opts, csp_iface_t * iface, csp_packet_t * packet) {


	/* CRC32 verified packet */
	if (packet->id.flags & CSP_FCRC32) {
		/* Verify CRC32 (does not include header for backwards compatability with csp1.x) */
		if (csp_crc32_verify(packet) != CSP_ERR_NONE) {
			iface->rx_error++;
			return CSP_ERR_CRC32;
		}
	} else if (security_opts & CSP_SO_CRC32REQ) {
		iface->rx_error++;
		return CSP_ERR_CRC32;
	}

#if (CSP_USE_HMAC)
	/* HMAC authenticated packet */
	if (packet->id.flags & CSP_FHMAC) {
		/* Verify HMAC (does not include header for backwards compatability with csp1.x) */
		if (csp_hmac_verify(packet, false) != CSP_ERR_NONE) {
			/* HMAC failed */
			iface->autherr++;
			return CSP_ERR_HMAC;
		}
	} else if (security_opts & CSP_SO_HMACREQ) {
		iface->autherr++;
		return CSP_ERR_HMAC;
	}
#endif

#if (CSP_USE_RDP)
	/* RDP packet */
	if (!(packet->id.flags & CSP_FRDP)) {
		if (security_opts & CSP_SO_RDPREQ) {
			iface->rx_error++;
			return CSP_ERR_INVAL;
		}
	}
#endif

	return CSP_ERR_NONE;
}